

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minilua.c
# Opt level: O0

l_mem propagatemark(global_State *g)

{
  GCObject *cl_00;
  int iVar1;
  int local_4c;
  Proto *p;
  lua_State *th;
  Closure *cl;
  Table *h;
  GCObject *o;
  global_State *g_local;
  
  cl_00 = g->gray;
  (cl_00->gch).marked = (cl_00->gch).marked | 4;
  switch((cl_00->gch).tt) {
  case '\x05':
    g->gray = (cl_00->h).gclist;
    iVar1 = traversetable(g,&cl_00->h);
    if (iVar1 != 0) {
      (cl_00->gch).marked = (cl_00->gch).marked & 0xfb;
    }
    g_local = (global_State *)
              ((long)(cl_00->h).sizearray * 0x10 + 0x40 +
              (1L << ((cl_00->h).lsizenode & 0x3f)) * 0x28);
    break;
  case '\x06':
    g->gray = (GCObject *)(cl_00->h).metatable;
    traverseclosure(g,&cl_00->cl);
    if ((cl_00->h).flags == '\0') {
      local_4c = ((cl_00->h).lsizenode - 1) * 8 + 0x30;
    }
    else {
      local_4c = ((cl_00->h).lsizenode - 1) * 0x10 + 0x38;
    }
    g_local = (global_State *)(long)local_4c;
    break;
  default:
    g_local = (global_State *)0x0;
    break;
  case '\b':
    g->gray = (cl_00->th).gclist;
    (cl_00->th).gclist = g->grayagain;
    g->grayagain = cl_00;
    (cl_00->gch).marked = (cl_00->gch).marked & 0xfb;
    traversestack(g,&cl_00->th);
    g_local = (global_State *)
              ((long)(cl_00->p).sizep * 0x10 + 0xb8 + (long)(cl_00->p).sizelocvars * 0x28);
    break;
  case '\t':
    g->gray = (cl_00->p).gclist;
    traverseproto(g,&cl_00->p);
    g_local = (global_State *)
              ((long)(cl_00->p).sizecode * 4 + 0x78 + (long)(cl_00->p).sizep * 8 +
               (long)(cl_00->p).sizek * 0x10 + (long)(cl_00->p).sizelineinfo * 4 +
               (long)(cl_00->p).sizelocvars * 0x10 + (long)(cl_00->p).sizeupvalues * 8);
  }
  return (l_mem)g_local;
}

Assistant:

static l_mem propagatemark(global_State*g){
GCObject*o=g->gray;
gray2black(o);
switch(o->gch.tt){
case 5:{
Table*h=gco2h(o);
g->gray=h->gclist;
if(traversetable(g,h))
black2gray(o);
return sizeof(Table)+sizeof(TValue)*h->sizearray+
sizeof(Node)*sizenode(h);
}
case 6:{
Closure*cl=gco2cl(o);
g->gray=cl->c.gclist;
traverseclosure(g,cl);
return(cl->c.isC)?sizeCclosure(cl->c.nupvalues):
sizeLclosure(cl->l.nupvalues);
}
case 8:{
lua_State*th=gco2th(o);
g->gray=th->gclist;
th->gclist=g->grayagain;
g->grayagain=o;
black2gray(o);
traversestack(g,th);
return sizeof(lua_State)+sizeof(TValue)*th->stacksize+
sizeof(CallInfo)*th->size_ci;
}
case(8+1):{
Proto*p=gco2p(o);
g->gray=p->gclist;
traverseproto(g,p);
return sizeof(Proto)+sizeof(Instruction)*p->sizecode+
sizeof(Proto*)*p->sizep+
sizeof(TValue)*p->sizek+
sizeof(int)*p->sizelineinfo+
sizeof(LocVar)*p->sizelocvars+
sizeof(TString*)*p->sizeupvalues;
}
default:return 0;
}
}